

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<float2,_4UL,_bas::RawAllocator>::grow
          (Vector<float2,_4UL,_bas::RawAllocator> *this,size_t min_capacity)

{
  bool bVar1;
  size_t sVar2;
  unsigned_long uVar3;
  float2 *dst;
  float2 *new_array;
  size_t size;
  size_t min_capacity_local;
  Vector<float2,_4UL,_bas::RawAllocator> *this_local;
  
  sVar2 = capacity(this);
  if (sVar2 < min_capacity) {
    uVar3 = ceil_power_of_2<unsigned_long>(min_capacity);
    sVar2 = Vector<float2,_4UL,_bas::RawAllocator>::size(this);
    dst = (float2 *)RawAllocator::allocate((RawAllocator *)&this->field_0x18,uVar3 << 3,4);
    uninitialized_relocate_n<float2>(this->m_begin,sVar2,dst);
    bVar1 = is_small(this);
    if (!bVar1) {
      RawAllocator::free((RawAllocator *)&this->field_0x18,this->m_begin);
    }
    this->m_begin = dst;
    this->m_end = this->m_begin + sVar2;
    this->m_capacity_end = this->m_begin + uVar3;
  }
  return;
}

Assistant:

BAS_NOINLINE void grow(size_t min_capacity)
    {
        if (this->capacity() >= min_capacity) {
            return;
        }

        /* Round up to the next power of two. Otherwise consecutive calls to
         * grow can cause a reallocation every time even though the
         * min_capacity only increments. */
        min_capacity = ceil_power_of_2<size_t>(min_capacity);

        size_t size = this->size();

        T *new_array = (T *)m_allocator.allocate(
            min_capacity * (size_t)sizeof(T), std::alignment_of<T>::value);
        uninitialized_relocate_n(m_begin, size, new_array);

        if (!this->is_small()) {
            m_allocator.free(m_begin);
        }

        m_begin = new_array;
        m_end = m_begin + size;
        m_capacity_end = m_begin + min_capacity;
    }